

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

int zt_opt_verror_default(int code,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  char *__ptr;
  
  if ((code != 0) || (iVar1 = -1, fmt != (char *)0x0)) {
    __ptr = zt_opt_verror_str(code,fmt,ap);
    fprintf(_stderr,"%s\n",__ptr);
    iVar1 = code;
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
  }
  return iVar1;
}

Assistant:

int
zt_opt_verror_default(int code, char * fmt, va_list ap) {
    char * msg = NULL;

    if (!code && !fmt) {
        /* no code or format equates to calling exit */
        return -1;
    }

    msg = zt_opt_verror_str(code, fmt, ap);
    fprintf(stderr, "%s\n", msg);
    zt_free(msg);
    return code;
}